

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HPKE_Curve51_CP32_SHA256.c
# Opt level: O0

uint32_t Hacl_HPKE_Curve51_CP32_SHA256_setupBaseR
                   (Hacl_Impl_HPKE_context_s o_ctx,uint8_t *enc,uint8_t *skR,uint32_t infolen,
                   uint8_t *info)

{
  long lVar1;
  uint8_t *puVar2;
  uint32_t infolen_00;
  byte bVar3;
  __uint16_t _Var4;
  uint ikmlen;
  uint8_t *puVar5;
  undefined8 uStack_550;
  uint8_t auStack_548 [88];
  undefined8 uStack_4f0;
  uint8_t auStack_4e8 [88];
  undefined8 uStack_490;
  uint8_t auStack_488 [88];
  undefined8 uStack_430;
  uint8_t local_428 [24];
  undefined8 uStack_410;
  uint8_t auStack_408 [24];
  undefined8 uStack_3f0;
  uint8_t *local_3e8;
  uint8_t *local_3e0;
  uint8_t *local_3d8;
  uint8_t *local_3d0;
  uint8_t *local_3c8;
  uint8_t *local_3c0;
  uint8_t *local_3b8;
  uint8_t *local_3b0;
  Hacl_Impl_HPKE_context_s *local_3a8;
  uint8_t *local_3a0;
  uint8_t *uu____14;
  unsigned_long __vla_expr7;
  uint32_t len_1;
  uint8_t label_base_nonce [10];
  uint8_t *uu____13;
  unsigned_long __vla_expr6;
  uint32_t len4;
  uint8_t label_key [3];
  uint8_t *uu____12;
  unsigned_long __vla_expr5;
  uint32_t len3;
  uint8_t label_exp [3];
  uint8_t *uu____11;
  unsigned_long __vla_expr4;
  uint32_t len2;
  uint8_t label_secret [6];
  uint8_t *uu____10;
  unsigned_long __vla_expr3;
  uint8_t auStack_318 [4];
  uint32_t len1;
  uint8_t o_info_hash [32];
  uint8_t label_info_hash [9];
  uint8_t *uu____9;
  unsigned_long __vla_expr2;
  uint32_t len0_1;
  uint8_t *empty_1;
  uint8_t o_psk_id_hash [32];
  uint8_t label_psk_id_hash [11];
  uint8_t *uu____8;
  uint8_t *uu____7;
  uint8_t *uu____6;
  uint8_t *uu____5;
  undefined1 uStack_260;
  undefined1 uStack_25f;
  undefined1 uStack_25e;
  undefined1 uStack_25d;
  undefined1 uStack_25c;
  undefined1 uStack_25b;
  uint8_t suite_id [10];
  uint8_t o_secret [32];
  uint8_t o_context [65];
  uint8_t *uu____4;
  unsigned_long __vla_expr1;
  uint32_t len;
  uint8_t label_shared_secret [13];
  uint8_t *uu____3;
  unsigned_long __vla_expr0;
  uint32_t len0;
  uint8_t label_eae_prk [7];
  uint8_t *empty;
  uint8_t *uu____2;
  uint8_t *uu____1;
  uint8_t local_178 [3];
  uint8_t suite_id_kem [5];
  uint8_t o_eae_prk [32];
  uint8_t *dhm;
  uint32_t res20;
  uint8_t *pkR1;
  uint8_t *pkRm;
  uint8_t kemcontext [64];
  uint32_t res2;
  uint32_t res11;
  uint32_t res;
  uint8_t z;
  uint8_t uu____0;
  uint32_t i;
  uint8_t res0;
  uint8_t zeros [32];
  uint8_t dh [32];
  uint8_t *pkE;
  uint8_t shared [32];
  uint8_t local_58 [4];
  uint32_t res1;
  uint8_t pkR [32];
  uint8_t *info_local;
  uint32_t infolen_local;
  uint8_t *skR_local;
  uint8_t *enc_local;
  
  local_3a8 = &o_ctx;
  uStack_3f0 = 0x273345;
  memset(local_58,0,0x20);
  uStack_3f0 = 0x273352;
  Hacl_Curve25519_51_secret_to_public(local_58,skR);
  uStack_3f0 = 0x273369;
  memset(&pkE,0,0x20);
  uStack_3f0 = 0x273391;
  memset(zeros + 0x18,0,0x20);
  uStack_3f0 = 0x2733a4;
  memset(&i,0,0x20);
  uStack_3f0 = 0x2733bb;
  Hacl_Curve25519_51_scalarmult(zeros + 0x18,skR,enc);
  uu____0 = 0xff;
  for (res = 0; res < 0x20; res = res + 1) {
    uStack_3f0 = 0x2733f8;
    bVar3 = FStar_UInt8_eq_mask(zeros[(ulong)res + 0x18],*(uint8_t *)((long)&i + (ulong)res));
    uu____0 = bVar3 & uu____0;
  }
  uStack_3f0 = 0x273474;
  memset(&pkRm,0,0x40);
  if (uu____0 != 0xff) {
    uStack_3f0 = 0x2734b1;
    Hacl_Curve25519_51_secret_to_public(kemcontext + 0x18,skR);
    pkRm = *(uint8_t **)enc;
    kemcontext._0_8_ = *(undefined8 *)(enc + 8);
    kemcontext._8_8_ = *(undefined8 *)(enc + 0x10);
    kemcontext._16_8_ = *(undefined8 *)(enc + 0x18);
    uStack_3f0 = 0x273518;
    memset(local_178,0,0x20);
    uStack_3f0 = 0x27352b;
    memset((void *)((long)&uu____1 + 3),0,5);
    uu____1._3_1_ = 0x4b;
    uu____1._4_1_ = 0x45;
    uu____1._5_1_ = 0x4d;
    uu____1._6_1_ = 0;
    uu____1._7_1_ = ' ';
    local_3b0 = local_428;
    uStack_430 = 0x273635;
    memset(local_3b0,0,0x33);
    puVar5 = local_3b0;
    *local_3b0 = 'H';
    puVar5[1] = 'P';
    puVar5[2] = 'K';
    puVar5[3] = 'E';
    puVar5[4] = '-';
    puVar5[5] = 'v';
    puVar5[6] = '1';
    *(undefined4 *)(puVar5 + 7) = uu____1._3_4_;
    puVar5[0xb] = uu____1._7_1_;
    puVar5[0xc] = 'e';
    puVar5[0xd] = 'a';
    puVar5[0xe] = 'e';
    puVar5[0xf] = '_';
    puVar5[0x10] = 'p';
    puVar5[0x11] = 'r';
    puVar5[0x12] = 'k';
    *(undefined8 *)(puVar5 + 0x13) = zeros._24_8_;
    *(undefined8 *)(puVar5 + 0x1b) = dh._0_8_;
    *(undefined8 *)(puVar5 + 0x23) = dh._8_8_;
    *(undefined8 *)(puVar5 + 0x2b) = dh._16_8_;
    uStack_430 = 0x273700;
    Hacl_HKDF_extract_sha2_256(local_178,(uint8_t *)((long)&uu____1 + 3),0,puVar5,0x33);
    local_3b8 = auStack_488;
    uStack_490 = 0x27379f;
    memset(local_3b8,0,0x5b);
    uStack_490 = 0x2737a9;
    _Var4 = __bswap_16(0x20);
    uStack_490 = 0x2737b8;
    store16(local_3b8,_Var4);
    puVar5 = local_3b8;
    local_3b8[2] = 'H';
    puVar5[3] = 'P';
    puVar5[4] = 'K';
    puVar5[5] = 'E';
    puVar5[6] = '-';
    puVar5[7] = 'v';
    puVar5[8] = '1';
    *(undefined4 *)(puVar5 + 9) = uu____1._3_4_;
    puVar5[0xd] = uu____1._7_1_;
    puVar5[0xe] = 's';
    puVar5[0xf] = 'h';
    puVar5[0x10] = 'a';
    puVar5[0x11] = 'r';
    puVar5[0x12] = 'e';
    puVar5[0x13] = 'd';
    puVar5[0x14] = '_';
    puVar5[0x15] = 's';
    puVar5[0x16] = 'e';
    puVar5[0x17] = 'c';
    puVar5[0x18] = 'r';
    puVar5[0x19] = 'e';
    puVar5[0x1a] = 't';
    uStack_490 = 0x27385d;
    memcpy(puVar5 + 0x1b,&pkRm,0x40);
    uStack_490 = 0x273884;
    Hacl_HKDF_expand_sha2_256((uint8_t *)&pkE,local_178,0x20,local_3b8,0x5b,0x20);
    uStack_3f0 = 0x2738d0;
    memset(o_secret + 0x18,0,0x41);
    uStack_3f0 = 0x2738e3;
    memset(suite_id + 2,0,0x20);
    uStack_3f0 = 0x2738f6;
    memset((void *)((long)&uu____5 + 6),0,10);
    uu____5._6_1_ = 0x48;
    uu____5._7_1_ = 0x50;
    uStack_260 = 0x4b;
    uStack_25f = 0x45;
    uStack_25e = 0;
    uStack_25d = 0x20;
    uStack_25c = 0;
    uStack_25b = 1;
    suite_id[0] = '\0';
    suite_id[1] = '\x03';
    stack0xfffffffffffffd6d = 0x685f64695f6b7370;
    uStack_3f0 = 0x2739df;
    memset(&empty_1,0,0x20);
    uStack_410 = 0x273a6e;
    local_3c0 = auStack_408;
    memset(auStack_408,0,0x1c);
    puVar5 = local_3c0;
    *local_3c0 = 'H';
    puVar5[1] = 'P';
    puVar5[2] = 'K';
    puVar5[3] = 'E';
    puVar5[4] = '-';
    puVar5[5] = 'v';
    puVar5[6] = '1';
    *(undefined8 *)(puVar5 + 7) = stack0xfffffffffffffd9e;
    *(undefined2 *)(puVar5 + 0xf) = suite_id._0_2_;
    *(undefined8 *)(puVar5 + 0x11) = stack0xfffffffffffffd6d;
    puVar5[0x19] = 'a';
    puVar5[0x1a] = 's';
    puVar5[0x1b] = 'h';
    uStack_410 = 0x273b20;
    Hacl_HKDF_extract_sha2_256((uint8_t *)&empty_1,(uint8_t *)((long)&uu____5 + 6),0,puVar5,0x1c);
    uStack_410 = 0x273b4d;
    memset(auStack_318,0,0x20);
    ikmlen = infolen + 0x1a;
    lVar1 = -((ulong)ikmlen + 0xf & 0xfffffffffffffff0);
    puVar5 = auStack_408 + lVar1;
    local_3c8 = puVar5;
    *(undefined8 *)((long)&uStack_410 + lVar1) = 0x273bc8;
    memset(puVar5,0,(ulong)ikmlen);
    puVar5 = local_3c8;
    *local_3c8 = 'H';
    puVar5[1] = 'P';
    puVar5[2] = 'K';
    puVar5[3] = 'E';
    puVar5[4] = '-';
    puVar5[5] = 'v';
    puVar5[6] = '1';
    *(undefined8 *)(puVar5 + 7) = stack0xfffffffffffffd9e;
    *(undefined2 *)(puVar5 + 0xf) = suite_id._0_2_;
    puVar5[0x11] = 'i';
    puVar5[0x12] = 'n';
    puVar5[0x13] = 'f';
    puVar5[0x14] = 'o';
    puVar5[0x15] = '_';
    puVar5[0x16] = 'h';
    puVar5[0x17] = 'a';
    puVar5[0x18] = 's';
    puVar5[0x19] = 'h';
    *(undefined8 *)((long)&uStack_410 + lVar1) = 0x273c62;
    memcpy(puVar5 + 0x1a,info,(ulong)infolen);
    puVar5 = local_3c8;
    *(undefined8 *)((long)&uStack_410 + lVar1) = 0x273c85;
    Hacl_HKDF_extract_sha2_256(auStack_318,(uint8_t *)((long)&uu____5 + 6),0,puVar5,ikmlen);
    o_secret[0x18] = '\0';
    stack0xfffffffffffffdc9 = empty_1;
    local_3d0 = local_428 + lVar1;
    *(undefined8 *)((long)&uStack_430 + lVar1) = 0x273d8f;
    memset(local_428 + lVar1,0,0x17);
    puVar5 = local_3d0;
    *local_3d0 = 'H';
    puVar5[1] = 'P';
    puVar5[2] = 'K';
    puVar5[3] = 'E';
    puVar5[4] = '-';
    puVar5[5] = 'v';
    puVar5[6] = '1';
    *(undefined8 *)(puVar5 + 7) = stack0xfffffffffffffd9e;
    *(undefined2 *)(puVar5 + 0xf) = suite_id._0_2_;
    puVar5[0x11] = 's';
    puVar5[0x12] = 'e';
    puVar5[0x13] = 'c';
    puVar5[0x14] = 'r';
    puVar5[0x15] = 'e';
    puVar5[0x16] = 't';
    *(undefined8 *)((long)&uStack_430 + lVar1) = 0x273e36;
    Hacl_HKDF_extract_sha2_256(suite_id + 2,(uint8_t *)&pkE,0x20,puVar5,0x17);
    local_3d8 = auStack_488 + lVar1;
    *(undefined8 *)((long)&uStack_490 + lVar1) = 0x273ec9;
    memset(auStack_488 + lVar1,0,0x57);
    *(undefined8 *)((long)&uStack_490 + lVar1) = 0x273ed3;
    _Var4 = __bswap_16(0x20);
    puVar5 = local_3d8;
    *(undefined8 *)((long)&uStack_490 + lVar1) = 0x273ee2;
    store16(puVar5,_Var4);
    puVar5 = local_3d8;
    local_3d8[2] = 'H';
    puVar5[3] = 'P';
    puVar5[4] = 'K';
    puVar5[5] = 'E';
    puVar5[6] = '-';
    puVar5[7] = 'v';
    puVar5[8] = '1';
    *(undefined8 *)(puVar5 + 9) = stack0xfffffffffffffd9e;
    *(undefined2 *)(puVar5 + 0x11) = suite_id._0_2_;
    puVar5[0x13] = 'e';
    puVar5[0x14] = 'x';
    puVar5[0x15] = 'p';
    *(undefined8 *)((long)&uStack_490 + lVar1) = 0x273f82;
    memcpy(puVar5 + 0x16,o_secret + 0x18,0x41);
    puVar2 = local_3d8;
    puVar5 = local_3a8->ctx_exporter;
    *(undefined8 *)((long)&uStack_490 + lVar1) = 0x273fb0;
    Hacl_HKDF_expand_sha2_256(puVar5,suite_id + 2,0x20,puVar2,0x57,0x20);
    local_3e0 = auStack_4e8 + lVar1;
    *(undefined8 *)((long)&uStack_4f0 + lVar1) = 0x274043;
    memset(auStack_4e8 + lVar1,0,0x57);
    *(undefined8 *)((long)&uStack_4f0 + lVar1) = 0x27404d;
    _Var4 = __bswap_16(0x20);
    puVar5 = local_3e0;
    *(undefined8 *)((long)&uStack_4f0 + lVar1) = 0x27405c;
    store16(puVar5,_Var4);
    puVar5 = local_3e0;
    label_base_nonce._2_8_ = local_3e0 + 2;
    *(uint8_t *)label_base_nonce._2_8_ = 'H';
    *(undefined1 *)(label_base_nonce._2_8_ + 1) = 0x50;
    *(undefined1 *)(label_base_nonce._2_8_ + 2) = 0x4b;
    *(undefined1 *)(label_base_nonce._2_8_ + 3) = 0x45;
    *(undefined1 *)(label_base_nonce._2_8_ + 4) = 0x2d;
    *(undefined1 *)(label_base_nonce._2_8_ + 5) = 0x76;
    *(undefined1 *)(label_base_nonce._2_8_ + 6) = 0x31;
    *(undefined8 *)(puVar5 + 9) = stack0xfffffffffffffd9e;
    *(undefined2 *)(puVar5 + 0x11) = suite_id._0_2_;
    puVar5[0x13] = 'k';
    puVar5[0x14] = 'e';
    puVar5[0x15] = 'y';
    *(undefined8 *)((long)&uStack_4f0 + lVar1) = 0x2740fc;
    memcpy(puVar5 + 0x16,o_secret + 0x18,0x41);
    puVar2 = local_3e0;
    puVar5 = local_3a8->ctx_key;
    *(undefined8 *)((long)&uStack_4f0 + lVar1) = 0x274129;
    Hacl_HKDF_expand_sha2_256(puVar5,suite_id + 2,0x20,puVar2,0x57,0x20);
    stack0xfffffffffffffc76 = 0x6e6f6e5f65736162;
    label_base_nonce[0] = 'c';
    label_base_nonce[1] = 'e';
    __vla_expr7._0_4_ = 0x5e;
    uu____14 = (uint8_t *)0x5e;
    local_3e8 = auStack_548 + lVar1;
    *(undefined8 *)((long)&uStack_550 + lVar1) = 0x2741be;
    memset(auStack_548 + lVar1,0,0x5e);
    *(undefined8 *)((long)&uStack_550 + lVar1) = 0x2741c8;
    _Var4 = __bswap_16(0xc);
    puVar5 = local_3e8;
    *(undefined8 *)((long)&uStack_550 + lVar1) = 0x2741d7;
    store16(puVar5,_Var4);
    local_3a0 = local_3e8 + 2;
    *local_3a0 = 'H';
    local_3a0[1] = 'P';
    local_3a0[2] = 'K';
    local_3a0[3] = 'E';
    local_3a0[4] = '-';
    local_3a0[5] = 'v';
    local_3a0[6] = '1';
    *(undefined8 *)(local_3e8 + 9) = stack0xfffffffffffffd9e;
    *(undefined2 *)(local_3e8 + 0x11) = suite_id._0_2_;
    *(undefined8 *)(local_3e8 + 0x13) = stack0xfffffffffffffc76;
    *(undefined2 *)(local_3e8 + 0x1b) = label_base_nonce._0_2_;
    puVar5 = local_3e8 + 0x1d;
    *(undefined8 *)((long)&uStack_550 + lVar1) = 0x274279;
    memcpy(puVar5,o_secret + 0x18,0x41);
    infolen_00 = (uint32_t)__vla_expr7;
    puVar2 = local_3e8;
    puVar5 = local_3a8->ctx_nonce;
    *(undefined8 *)((long)&uStack_550 + lVar1) = 0x2742a9;
    Hacl_HKDF_expand_sha2_256(puVar5,suite_id + 2,0x20,puVar2,infolen_00,0xc);
    *local_3a8->ctx_seq = 0;
  }
  enc_local._4_4_ = (uint)(uu____0 == 0xff);
  return enc_local._4_4_;
}

Assistant:

uint32_t
Hacl_HPKE_Curve51_CP32_SHA256_setupBaseR(
  Hacl_Impl_HPKE_context_s o_ctx,
  uint8_t *enc,
  uint8_t *skR,
  uint32_t infolen,
  uint8_t *info
)
{
  uint8_t pkR[32U] = { 0U };
  Hacl_Curve25519_51_secret_to_public(pkR, skR);
  uint32_t res1 = 0U;
  uint8_t shared[32U] = { 0U };
  if (res1 == 0U)
  {
    uint8_t *pkE = enc;
    uint8_t dh[32U] = { 0U };
    uint8_t zeros[32U] = { 0U };
    Hacl_Curve25519_51_scalarmult(dh, skR, pkE);
    uint8_t res0 = 255U;
    for (uint32_t i = 0U; i < 32U; i++)
    {
      uint8_t uu____0 = FStar_UInt8_eq_mask(dh[i], zeros[i]);
      res0 = (uint32_t)uu____0 & (uint32_t)res0;
    }
    uint8_t z = res0;
    uint32_t res;
    if (z == 255U)
    {
      res = 1U;
    }
    else
    {
      res = 0U;
    }
    uint32_t res11 = res;
    uint32_t res2;
    uint8_t kemcontext[64U] = { 0U };
    if (res11 == 0U)
    {
      uint8_t *pkRm = kemcontext + 32U;
      uint8_t *pkR1 = pkRm;
      Hacl_Curve25519_51_secret_to_public(pkR1, skR);
      uint32_t res20 = 0U;
      if (res20 == 0U)
      {
        memcpy(kemcontext, enc, 32U * sizeof (uint8_t));
        uint8_t *dhm = dh;
        uint8_t o_eae_prk[32U] = { 0U };
        uint8_t suite_id_kem[5U] = { 0U };
        uint8_t *uu____1 = suite_id_kem;
        uu____1[0U] = 0x4bU;
        uu____1[1U] = 0x45U;
        uu____1[2U] = 0x4dU;
        uint8_t *uu____2 = suite_id_kem + 3U;
        uu____2[0U] = 0U;
        uu____2[1U] = 32U;
        uint8_t *empty = suite_id_kem;
        uint8_t label_eae_prk[7U] = { 0x65U, 0x61U, 0x65U, 0x5fU, 0x70U, 0x72U, 0x6bU };
        uint32_t len0 = 51U;
        KRML_CHECK_SIZE(sizeof (uint8_t), len0);
        uint8_t tmp0[len0];
        memset(tmp0, 0U, len0 * sizeof (uint8_t));
        uint8_t *uu____3 = tmp0;
        uu____3[0U] = 0x48U;
        uu____3[1U] = 0x50U;
        uu____3[2U] = 0x4bU;
        uu____3[3U] = 0x45U;
        uu____3[4U] = 0x2dU;
        uu____3[5U] = 0x76U;
        uu____3[6U] = 0x31U;
        memcpy(tmp0 + 7U, suite_id_kem, 5U * sizeof (uint8_t));
        memcpy(tmp0 + 12U, label_eae_prk, 7U * sizeof (uint8_t));
        memcpy(tmp0 + 19U, dhm, 32U * sizeof (uint8_t));
        Hacl_HKDF_extract_sha2_256(o_eae_prk, empty, 0U, tmp0, len0);
        uint8_t
        label_shared_secret[13U] =
          {
            0x73U, 0x68U, 0x61U, 0x72U, 0x65U, 0x64U, 0x5fU, 0x73U, 0x65U, 0x63U, 0x72U, 0x65U,
            0x74U
          };
        uint32_t len = 91U;
        KRML_CHECK_SIZE(sizeof (uint8_t), len);
        uint8_t tmp[len];
        memset(tmp, 0U, len * sizeof (uint8_t));
        store16_be(tmp, (uint16_t)32U);
        uint8_t *uu____4 = tmp + 2U;
        uu____4[0U] = 0x48U;
        uu____4[1U] = 0x50U;
        uu____4[2U] = 0x4bU;
        uu____4[3U] = 0x45U;
        uu____4[4U] = 0x2dU;
        uu____4[5U] = 0x76U;
        uu____4[6U] = 0x31U;
        memcpy(tmp + 9U, suite_id_kem, 5U * sizeof (uint8_t));
        memcpy(tmp + 14U, label_shared_secret, 13U * sizeof (uint8_t));
        memcpy(tmp + 27U, kemcontext, 64U * sizeof (uint8_t));
        Hacl_HKDF_expand_sha2_256(shared, o_eae_prk, 32U, tmp, len, 32U);
        res2 = 0U;
      }
      else
      {
        res2 = 1U;
      }
    }
    else
    {
      res2 = 1U;
    }
    if (res2 == 0U)
    {
      uint8_t o_context[65U] = { 0U };
      uint8_t o_secret[32U] = { 0U };
      uint8_t suite_id[10U] = { 0U };
      uint8_t *uu____5 = suite_id;
      uu____5[0U] = 0x48U;
      uu____5[1U] = 0x50U;
      uu____5[2U] = 0x4bU;
      uu____5[3U] = 0x45U;
      uint8_t *uu____6 = suite_id + 4U;
      uu____6[0U] = 0U;
      uu____6[1U] = 32U;
      uint8_t *uu____7 = suite_id + 6U;
      uu____7[0U] = 0U;
      uu____7[1U] = 1U;
      uint8_t *uu____8 = suite_id + 8U;
      uu____8[0U] = 0U;
      uu____8[1U] = 3U;
      uint8_t
      label_psk_id_hash[11U] =
        { 0x70U, 0x73U, 0x6bU, 0x5fU, 0x69U, 0x64U, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
      uint8_t o_psk_id_hash[32U] = { 0U };
      uint8_t *empty = suite_id;
      uint32_t len0 = 28U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len0);
      uint8_t tmp0[len0];
      memset(tmp0, 0U, len0 * sizeof (uint8_t));
      uint8_t *uu____9 = tmp0;
      uu____9[0U] = 0x48U;
      uu____9[1U] = 0x50U;
      uu____9[2U] = 0x4bU;
      uu____9[3U] = 0x45U;
      uu____9[4U] = 0x2dU;
      uu____9[5U] = 0x76U;
      uu____9[6U] = 0x31U;
      memcpy(tmp0 + 7U, suite_id, 10U * sizeof (uint8_t));
      memcpy(tmp0 + 17U, label_psk_id_hash, 11U * sizeof (uint8_t));
      memcpy(tmp0 + 28U, empty, 0U * sizeof (uint8_t));
      Hacl_HKDF_extract_sha2_256(o_psk_id_hash, empty, 0U, tmp0, len0);
      uint8_t
      label_info_hash[9U] = { 0x69U, 0x6eU, 0x66U, 0x6fU, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
      uint8_t o_info_hash[32U] = { 0U };
      uint32_t len1 = 26U + infolen;
      KRML_CHECK_SIZE(sizeof (uint8_t), len1);
      uint8_t tmp1[len1];
      memset(tmp1, 0U, len1 * sizeof (uint8_t));
      uint8_t *uu____10 = tmp1;
      uu____10[0U] = 0x48U;
      uu____10[1U] = 0x50U;
      uu____10[2U] = 0x4bU;
      uu____10[3U] = 0x45U;
      uu____10[4U] = 0x2dU;
      uu____10[5U] = 0x76U;
      uu____10[6U] = 0x31U;
      memcpy(tmp1 + 7U, suite_id, 10U * sizeof (uint8_t));
      memcpy(tmp1 + 17U, label_info_hash, 9U * sizeof (uint8_t));
      memcpy(tmp1 + 26U, info, infolen * sizeof (uint8_t));
      Hacl_HKDF_extract_sha2_256(o_info_hash, empty, 0U, tmp1, len1);
      o_context[0U] = 0U;
      memcpy(o_context + 1U, o_psk_id_hash, 32U * sizeof (uint8_t));
      memcpy(o_context + 33U, o_info_hash, 32U * sizeof (uint8_t));
      uint8_t label_secret[6U] = { 0x73U, 0x65U, 0x63U, 0x72U, 0x65U, 0x74U };
      uint32_t len2 = 23U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len2);
      uint8_t tmp2[len2];
      memset(tmp2, 0U, len2 * sizeof (uint8_t));
      uint8_t *uu____11 = tmp2;
      uu____11[0U] = 0x48U;
      uu____11[1U] = 0x50U;
      uu____11[2U] = 0x4bU;
      uu____11[3U] = 0x45U;
      uu____11[4U] = 0x2dU;
      uu____11[5U] = 0x76U;
      uu____11[6U] = 0x31U;
      memcpy(tmp2 + 7U, suite_id, 10U * sizeof (uint8_t));
      memcpy(tmp2 + 17U, label_secret, 6U * sizeof (uint8_t));
      memcpy(tmp2 + 23U, empty, 0U * sizeof (uint8_t));
      Hacl_HKDF_extract_sha2_256(o_secret, shared, 32U, tmp2, len2);
      uint8_t label_exp[3U] = { 0x65U, 0x78U, 0x70U };
      uint32_t len3 = 87U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len3);
      uint8_t tmp3[len3];
      memset(tmp3, 0U, len3 * sizeof (uint8_t));
      store16_be(tmp3, (uint16_t)32U);
      uint8_t *uu____12 = tmp3 + 2U;
      uu____12[0U] = 0x48U;
      uu____12[1U] = 0x50U;
      uu____12[2U] = 0x4bU;
      uu____12[3U] = 0x45U;
      uu____12[4U] = 0x2dU;
      uu____12[5U] = 0x76U;
      uu____12[6U] = 0x31U;
      memcpy(tmp3 + 9U, suite_id, 10U * sizeof (uint8_t));
      memcpy(tmp3 + 19U, label_exp, 3U * sizeof (uint8_t));
      memcpy(tmp3 + 22U, o_context, 65U * sizeof (uint8_t));
      Hacl_HKDF_expand_sha2_256(o_ctx.ctx_exporter, o_secret, 32U, tmp3, len3, 32U);
      uint8_t label_key[3U] = { 0x6bU, 0x65U, 0x79U };
      uint32_t len4 = 87U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len4);
      uint8_t tmp4[len4];
      memset(tmp4, 0U, len4 * sizeof (uint8_t));
      store16_be(tmp4, (uint16_t)32U);
      uint8_t *uu____13 = tmp4 + 2U;
      uu____13[0U] = 0x48U;
      uu____13[1U] = 0x50U;
      uu____13[2U] = 0x4bU;
      uu____13[3U] = 0x45U;
      uu____13[4U] = 0x2dU;
      uu____13[5U] = 0x76U;
      uu____13[6U] = 0x31U;
      memcpy(tmp4 + 9U, suite_id, 10U * sizeof (uint8_t));
      memcpy(tmp4 + 19U, label_key, 3U * sizeof (uint8_t));
      memcpy(tmp4 + 22U, o_context, 65U * sizeof (uint8_t));
      Hacl_HKDF_expand_sha2_256(o_ctx.ctx_key, o_secret, 32U, tmp4, len4, 32U);
      uint8_t
      label_base_nonce[10U] =
        { 0x62U, 0x61U, 0x73U, 0x65U, 0x5fU, 0x6eU, 0x6fU, 0x6eU, 0x63U, 0x65U };
      uint32_t len = 94U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len);
      uint8_t tmp[len];
      memset(tmp, 0U, len * sizeof (uint8_t));
      store16_be(tmp, (uint16_t)12U);
      uint8_t *uu____14 = tmp + 2U;
      uu____14[0U] = 0x48U;
      uu____14[1U] = 0x50U;
      uu____14[2U] = 0x4bU;
      uu____14[3U] = 0x45U;
      uu____14[4U] = 0x2dU;
      uu____14[5U] = 0x76U;
      uu____14[6U] = 0x31U;
      memcpy(tmp + 9U, suite_id, 10U * sizeof (uint8_t));
      memcpy(tmp + 19U, label_base_nonce, 10U * sizeof (uint8_t));
      memcpy(tmp + 29U, o_context, 65U * sizeof (uint8_t));
      Hacl_HKDF_expand_sha2_256(o_ctx.ctx_nonce, o_secret, 32U, tmp, len, 12U);
      o_ctx.ctx_seq[0U] = 0ULL;
      return 0U;
    }
    return 1U;
  }
  return 1U;
}